

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

char * testing::internal::GetAnsiColorCode(GTestColor color)

{
  GTestColor color_local;
  char *local_8;
  
  if (color == COLOR_RED) {
    local_8 = "1";
  }
  else if (color == COLOR_GREEN) {
    local_8 = "2";
  }
  else if (color == COLOR_YELLOW) {
    local_8 = "3";
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static const char* GetAnsiColorCode(GTestColor color) {
  switch (color) {
    case COLOR_RED:     return "1";
    case COLOR_GREEN:   return "2";
    case COLOR_YELLOW:  return "3";
    default:            return NULL;
  };
}